

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

Error * ot::commissioner::BbrDatasetFromJson
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,string *aJson)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_108;
  string local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type sStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type sStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  string *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  __return_storage_ptr__->mCode = kNone;
  local_70 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_70;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pcVar2 = local_d8 + 0x10;
  sStack_b0 = 0;
  local_a8._8_8_ = 0;
  sStack_90 = 0;
  local_88._8_8_ = 0;
  local_78._0_2_ = 0;
  local_78._2_6_ = 0;
  local_c8._M_allocated_capacity = 0;
  local_c8._8_8_ = 0;
  local_d8._8_8_ = (char *)0x0;
  local_b8._M_p = (pointer)&local_a8;
  local_a8._M_allocated_capacity = 0;
  local_88._M_allocated_capacity = 0;
  local_d8._0_8_ = pcVar2;
  local_98._M_p = (pointer)&local_88;
  local_60 = aJson;
  std::__cxx11::string::operator=((string *)aDataset,(string *)local_d8);
  local_68 = (string *)&aDataset->mRegistrarHostname;
  std::__cxx11::string::operator=(local_68,(string *)&local_b8);
  std::__cxx11::string::operator=((string *)&aDataset->mRegistrarIpv6Addr,(string *)&local_98);
  aDataset->mPresentFlags = (uint16_t)local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p);
  }
  if ((char *)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_);
  }
  StripComments((string *)local_d8,local_60);
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_120,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_d8._0_8_,(char *)(local_d8._8_8_ + local_d8._0_8_));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_130,(input_adapter *)local_120,(parser_callback_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  if ((char *)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_);
  }
  if (local_130[0] == null) {
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
    local_d8._8_8_ = "Empty BBR dataset from JSON";
    local_c8._M_allocated_capacity = 0x1b;
    local_c8._8_8_ = 0;
    sStack_b0 = 0;
    pcVar2 = "Empty BBR dataset from JSON";
    local_b8._M_p = (pointer)local_d8;
    do {
      pcVar1 = pcVar2 + 1;
      if (*pcVar2 == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = pcVar2 + 2;
      }
      else if (*pcVar2 == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar2,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_d8);
      }
      pcVar2 = pcVar1;
    } while (pcVar1 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f8,(v10 *)"Empty BBR dataset from JSON",(string_view)ZEXT816(0x1b),args);
    local_120._0_4_ = kNotFound;
    local_118._M_pi = &local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    __return_storage_ptr__->mCode = local_120._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_118);
    if (local_118._M_pi != &local_108) {
      operator_delete(local_118._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0012b73f;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::BbrDataset,_ot::commissioner::BbrDataset,_0>
              ((BbrDataset *)local_d8,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_130);
    std::__cxx11::string::operator=((string *)aDataset,(string *)local_d8);
    std::__cxx11::string::operator=(local_68,(string *)&local_b8);
    std::__cxx11::string::operator=((string *)&aDataset->mRegistrarIpv6Addr,(string *)&local_98);
    aDataset->mPresentFlags = (uint16_t)local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p);
    }
    local_f8._M_dataplus._M_p = (pointer)local_d8._0_8_;
    if ((char *)local_d8._0_8_ == pcVar2) goto LAB_0012b73f;
  }
  operator_delete(local_f8._M_dataplus._M_p);
LAB_0012b73f:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_130);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_130 + 8),local_130[0]);
  return __return_storage_ptr__;
}

Assistant:

Error BbrDatasetFromJson(BbrDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = BbrDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty BBR dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}